

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

void __thiscall jbcoin::STObject::STObject(STObject *this,SOTemplate *type,SField *name)

{
  SField *name_local;
  SOTemplate *type_local;
  STObject *this_local;
  
  STBase::STBase(&this->super_STBase,name);
  CountedObject<jbcoin::STObject>::CountedObject((CountedObject<jbcoin::STObject> *)this);
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STObject_0051a068;
  std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::vector(&this->v_);
  set(this,type);
  return;
}

Assistant:

STObject::STObject (SOTemplate const& type,
        SField const& name)
    : STBase (name)
{
    set (type);
}